

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.c
# Opt level: O0

int blob_write_json(blob_t *blobs,int count,char *filename)

{
  FILE *__stream;
  FILE *__stream_00;
  int *piVar1;
  char *pcVar2;
  undefined8 uVar3;
  int local_3c;
  int j;
  FILE *out;
  int i;
  char *filename_local;
  int count_local;
  blob_t *blobs_local;
  
  __stream_00 = fopen(filename,"wb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream,"failed to open %s : %s\n",filename,pcVar2);
    blobs_local._4_4_ = 0;
  }
  else {
    fprintf(__stream_00,"{\n  \"blobs\" : [\n");
    for (out._4_4_ = 0; out._4_4_ < count; out._4_4_ = out._4_4_ + 1) {
      fprintf(__stream_00,"    {\n");
      fprintf(__stream_00,"      \"label\" : %d,\n",(ulong)(uint)(int)blobs[out._4_4_].label);
      contour_write_json(&blobs[out._4_4_].external,"external",3,(FILE *)__stream_00);
      fprintf(__stream_00,",\n");
      if (blobs[out._4_4_].internal != (contour_t *)0x0) {
        fprintf(__stream_00,"      \"internals\" : [\n");
        local_3c = 0;
        while( true ) {
          if (blobs[out._4_4_].internal_count <= local_3c) break;
          contour_write_json(blobs[out._4_4_].internal + local_3c,(char *)0x0,4,(FILE *)__stream_00)
          ;
          uVar3 = 0x20;
          if (local_3c < blobs[out._4_4_].internal_count + -1) {
            uVar3 = 0x2c;
          }
          fprintf(__stream_00,"%c\n",uVar3);
          local_3c = local_3c + 1;
        }
        fprintf(__stream_00,"      ],\n");
      }
      fprintf(__stream_00,"      \"euler_number\": %d\n",
              (ulong)(uint)blobs[out._4_4_].internal_count);
      uVar3 = 0x20;
      if (out._4_4_ < count + -1) {
        uVar3 = 0x2c;
      }
      fprintf(__stream_00,"    }%c\n",uVar3);
    }
    fprintf(__stream_00,"  ]\n}\n");
    fclose(__stream_00);
    blobs_local._4_4_ = 1;
  }
  return blobs_local._4_4_;
}

Assistant:

int blob_write_json(blob_t *blobs, int count, const char *filename)
{
    int i;
    FILE *out = fopen(filename, "wb");
    if(NULL == out)
    {
        fprintf(stderr, "failed to open %s : %s\n", filename, strerror(errno));
        return 0;
    }
    fprintf(out, "{\n  \"blobs\" : [\n");
    for(i=0; i<count; i++)
    {
        fprintf(out, "    {\n");
        fprintf(out, "      \"label\" : %d,\n", blobs[i].label);    
        contour_write_json(&blobs[i].external, "external", 3, out);
        fprintf(out, ",\n");
        if(NULL != blobs[i].internal)
        {
            int j;
            fprintf(out, "      \"internals\" : [\n");
            for(j=0; j<blobs[i].internal_count; j++)
            {
                contour_write_json(blobs[i].internal+j, NULL, 4, out);
                fprintf(out, "%c\n", (j < (blobs[i].internal_count-1)) ? ',' : ' ');
            }
            fprintf(out, "      ],\n");
        }
        fprintf(out, "      \"euler_number\": %d\n", blobs[i].internal_count);
        fprintf(out, "    }%c\n", (i < (count-1)) ? ',' : ' ');
    }
    fprintf(out, "  ]\n}\n");
    fclose(out);
    return 1;
}